

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_Environment * __thiscall
ON_RenderEnvironment::ToOnEnvironment
          (ON_Environment *__return_storage_ptr__,ON_RenderEnvironment *this)

{
  bool bVar1;
  BackgroundProjections proj_00;
  ON_XMLNode *node;
  wchar_t *pwVar2;
  ON_4fColor OVar3;
  undefined1 local_378 [16];
  undefined1 local_368 [4];
  BackgroundProjections proj;
  undefined1 local_360 [8];
  ON_Texture tex;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_14c;
  undefined1 local_148 [8];
  ON_XMLParameters p;
  ON_XMLVariant v;
  ON_XMLNode *sim_node;
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lg;
  ON_RenderEnvironment *this_local;
  ON_Environment *env;
  
  lg._M_device = (mutex_type *)this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (&local_20,&((this->super_ON_RenderContent)._private)->m_mutex);
  ON_Environment::ON_Environment(__return_storage_ptr__);
  node = ON_RenderContentPrivate::XMLNode_Simulation((this->super_ON_RenderContent)._private);
  if (node != (ON_XMLNode *)0x0) {
    ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&p._private);
    ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_148,node);
    bVar1 = ON_XMLParameters::GetParam
                      ((ON_XMLParameters *)local_148,L"background-color",
                       (ON_XMLVariant *)&p._private);
    if (bVar1) {
      OVar3 = ::ON_XMLVariant::AsColor((ON_XMLVariant *)&p._private);
      unique0x1000010b = OVar3.m_color._0_8_;
      local_14c = (anon_union_4_2_6147a14e_for_ON_Color_15)
                  ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&tex.field_0x1fc);
      ON_Environment::SetBackgroundColor(__return_storage_ptr__,(ON_Color *)&local_14c);
    }
    bVar1 = ON_XMLParameters::GetParam
                      ((ON_XMLParameters *)local_148,L"background-image",
                       (ON_XMLVariant *)&p._private);
    if (bVar1) {
      ON_Texture::ON_Texture((ON_Texture *)local_360);
      ::ON_XMLVariant::AsString((ON_XMLVariant *)local_368);
      pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_368);
      ON_FileReference::SetFullPath((ON_FileReference *)&tex.m_mapping_channel_id,pwVar2,false);
      ON_wString::~ON_wString((ON_wString *)local_368);
      ON_Environment::SetBackgroundImage(__return_storage_ptr__,(ON_Texture *)local_360);
      ON_Texture::~ON_Texture((ON_Texture *)local_360);
    }
    bVar1 = ON_XMLParameters::GetParam
                      ((ON_XMLParameters *)local_148,L"background-projection",
                       (ON_XMLVariant *)&p._private);
    if (bVar1) {
      ::ON_XMLVariant::AsString((ON_XMLVariant *)local_378);
      pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_378);
      proj_00 = ON_Environment::ProjectionFromString(pwVar2);
      ON_wString::~ON_wString((ON_wString *)local_378);
      local_378._12_4_ = proj_00;
      ON_Environment::SetBackgroundProjection(__return_storage_ptr__,proj_00);
    }
    ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_148);
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&p._private);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

ON_Environment ON_RenderEnvironment::ToOnEnvironment(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_Environment env;

  const ON_XMLNode* sim_node = _private->XMLNode_Simulation();
  if (nullptr != sim_node)
  {
    ON_XMLVariant v;
    ON_XMLParameters p(*sim_node);

    if (p.GetParam(ON_ENVIRONMENT_SIMULATION_BACKGROUND_COLOR, v))
      env.SetBackgroundColor(v.AsColor());

    if (p.GetParam(ON_ENVIRONMENT_SIMULATION_BACKGROUND_IMAGE, v))
    {
      ON_Texture tex;
      tex.m_image_file_reference.SetFullPath(v.AsString(), false);
      env.SetBackgroundImage(tex);

      // TODO: More? Andy is thinking about this.
    }

    if (p.GetParam(ON_ENVIRONMENT_SIMULATION_BACKGROUND_PROJECTION, v))
    {
      const auto proj = ON_Environment::ProjectionFromString(v.AsString());
      env.SetBackgroundProjection(proj);
    }
  }

  return env;
}